

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O3

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  Allocator *pAVar3;
  int *piVar4;
  size_t sVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  void *pvVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  void *pvVar16;
  float *pfVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  void *pvVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  uint _w;
  uint uVar29;
  float *pfVar30;
  ulong uVar31;
  ulong uVar32;
  int k;
  float fVar33;
  ulong local_108;
  ulong local_100;
  allocator_type local_f1;
  Pooling *local_f0;
  Mat local_e8;
  long local_b0;
  ulong local_a8;
  float *local_a0;
  float *local_98;
  float *local_90;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  float *local_68;
  void *local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar15 = bottom_blob->w;
  iVar28 = bottom_blob->h;
  uVar11 = bottom_blob->c;
  uVar31 = (ulong)uVar11;
  sVar2 = bottom_blob->elemsize;
  local_f0 = this;
  if (this->global_pooling != 0) {
    pAVar3 = opt->blob_allocator;
    if ((((top_blob->dims == 1) && (top_blob->w == uVar11)) && (top_blob->elemsize == sVar2)) &&
       (top_blob->allocator == pAVar3)) {
      pvVar9 = top_blob->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
    }
    else {
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = sVar2;
      top_blob->allocator = pAVar3;
      top_blob->dims = 1;
      top_blob->w = uVar11;
      top_blob->h = 1;
      top_blob->c = 1;
      top_blob->cstep = (long)(int)uVar11;
      if (uVar11 == 0) {
        return -100;
      }
      uVar22 = sVar2 * (long)(int)uVar11 + 3 & 0xfffffffffffffffc;
      if (pAVar3 == (Allocator *)0x0) {
        pvVar16 = malloc(uVar22 + 0x1c);
        pvVar9 = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar9 - 8) = pvVar16;
      }
      else {
        pvVar9 = (void *)(*(code *)**(undefined8 **)pAVar3)(pAVar3,uVar22 + 4);
      }
      top_blob->data = pvVar9;
      top_blob->refcount = (int *)((long)pvVar9 + uVar22);
      *(undefined4 *)((long)pvVar9 + uVar22) = 1;
      this = local_f0;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar29 = iVar28 * iVar15;
    if (this->pooling_type == 0) {
      if ((int)uVar11 < 1) {
        return 0;
      }
      lVar13 = bottom_blob->cstep * bottom_blob->elemsize;
      pvVar16 = bottom_blob->data;
      uVar22 = 0;
      pvVar25 = pvVar16;
      do {
        fVar33 = *(float *)((long)pvVar16 + lVar13 * uVar22);
        if (0 < (int)uVar29) {
          uVar24 = 0;
          do {
            fVar1 = *(float *)((long)pvVar25 + uVar24 * 4);
            if (fVar33 <= fVar1) {
              fVar33 = fVar1;
            }
            uVar24 = uVar24 + 1;
          } while (uVar29 != uVar24);
        }
        *(float *)((long)pvVar9 + uVar22 * 4) = fVar33;
        uVar22 = uVar22 + 1;
        pvVar25 = (void *)((long)pvVar25 + lVar13);
      } while (uVar22 != uVar31);
    }
    else {
      if (this->pooling_type != 1) {
        return 0;
      }
      if ((int)uVar11 < 1) {
        return 0;
      }
      sVar2 = bottom_blob->cstep;
      sVar5 = bottom_blob->elemsize;
      pvVar16 = bottom_blob->data;
      uVar22 = 0;
      do {
        fVar33 = 0.0;
        if (0 < (int)uVar29) {
          uVar24 = 0;
          do {
            fVar33 = fVar33 + *(float *)((long)pvVar16 + uVar24 * 4);
            uVar24 = uVar24 + 1;
          } while (uVar29 != uVar24);
        }
        *(float *)((long)pvVar9 + uVar22 * 4) = fVar33 * (1.0 / (float)(int)uVar29);
        uVar22 = uVar22 + 1;
        pvVar16 = (void *)((long)pvVar16 + sVar2 * sVar5);
      } while (uVar22 != uVar31);
    }
    return 0;
  }
  local_e8.data = bottom_blob->data;
  local_e8.refcount = bottom_blob->refcount;
  local_e8.allocator = bottom_blob->allocator;
  local_e8.dims = bottom_blob->dims;
  local_e8.h = iVar28;
  local_e8.w = iVar15;
  local_e8.c = uVar11;
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + 1;
    UNLOCK();
    local_e8.w = bottom_blob->w;
    local_e8.h = bottom_blob->h;
    local_e8.c = bottom_blob->c;
  }
  local_e8.cstep = bottom_blob->cstep;
  if (this->pooling_type == 0) {
    fVar33 = -3.4028235e+38;
  }
  else {
    fVar33 = 0.0;
  }
  iVar19 = this->pad_mode;
  local_e8.elemsize = sVar2;
  if (iVar19 == 2) {
    iVar21 = 0;
    iVar19 = ~((iVar15 + -1) % this->stride_w) + this->kernel_w;
    iVar15 = ~((iVar28 + -1) % this->stride_h) + this->kernel_h;
    if ((0 < iVar19) || (0 < iVar15)) {
      copy_make_border(bottom_blob,&local_e8,iVar15 / 2,iVar15 - iVar15 / 2,iVar19 / 2,
                       iVar19 - iVar19 / 2,0,fVar33,opt->workspace_allocator,opt->num_threads);
      goto LAB_001132c5;
    }
    iVar18 = 0;
    iVar28 = local_e8.h;
    iVar15 = local_e8.w;
  }
  else if (iVar19 == 1) {
    copy_make_border(bottom_blob,&local_e8,this->pad_top,this->pad_bottom,this->pad_left,
                     this->pad_right,0,fVar33,opt->workspace_allocator,opt->num_threads);
LAB_001132c5:
    iVar21 = 0;
    iVar19 = -100;
    if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
    goto LAB_00113a52;
    iVar18 = 0;
    iVar28 = local_e8.h;
    iVar15 = local_e8.w;
  }
  else {
    iVar21 = 0;
    iVar18 = 0;
    if (iVar19 == 0) {
      iVar19 = ((iVar15 + this->pad_left + this->pad_right) - this->kernel_w) % this->stride_w;
      iVar15 = ((iVar28 + this->pad_top + this->pad_bottom) - this->kernel_h) % this->stride_h;
      iVar18 = this->stride_w - iVar19;
      if (iVar19 == 0) {
        iVar18 = 0;
      }
      iVar21 = this->stride_h - iVar15;
      if (iVar15 == 0) {
        iVar21 = 0;
      }
      copy_make_border(bottom_blob,&local_e8,this->pad_top,this->pad_bottom + iVar21,this->pad_left,
                       this->pad_right + iVar18,0,fVar33,opt->workspace_allocator,opt->num_threads);
      iVar19 = -100;
      if ((local_e8.data == (void *)0x0) ||
         (iVar28 = local_e8.h, iVar15 = local_e8.w, (long)local_e8.c * local_e8.cstep == 0))
      goto LAB_00113a52;
    }
  }
  iVar6 = (iVar15 - this->kernel_w) / this->stride_w;
  uVar22 = (long)(iVar28 - this->kernel_h) / (long)this->stride_h;
  local_a8 = uVar22 & 0xffffffff;
  _w = iVar6 + 1;
  uVar29 = (int)uVar22 + 1;
  Mat::create(top_blob,_w,uVar29,uVar11,sVar2,opt->blob_allocator);
  iVar19 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar22 = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar22,&local_f1);
    iVar28 = this->kernel_w;
    iVar19 = this->kernel_h;
    if (0 < iVar19) {
      iVar15 = iVar15 - iVar28;
      iVar10 = 0;
      iVar20 = 0;
      iVar23 = 0;
      do {
        if (0 < iVar28) {
          lVar13 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar23 + lVar13] = iVar20 + (int)lVar13;
            iVar28 = this->kernel_w;
            lVar13 = lVar13 + 1;
            iVar26 = (int)lVar13;
          } while (iVar26 < iVar28);
          iVar23 = iVar23 + iVar26;
          iVar19 = this->kernel_h;
          iVar20 = iVar20 + iVar26;
        }
        iVar20 = iVar20 + iVar15;
        iVar10 = iVar10 + 1;
      } while (iVar10 < iVar19);
    }
    iVar15 = (int)uVar22;
    if (this->pooling_type == 0) {
      if (0 < (int)uVar11) {
        local_90 = (float *)(local_e8.cstep * local_e8.elemsize);
        local_98 = (float *)CONCAT44(local_98._4_4_,local_e8.w);
        local_a0 = (float *)top_blob->data;
        local_b0 = top_blob->cstep * top_blob->elemsize;
        local_108 = 0;
        do {
          if (-1 < (int)local_a8) {
            pfVar17 = (float *)(local_b0 * local_108 + (long)local_a0);
            iVar28 = local_f0->stride_h;
            iVar19 = local_f0->stride_w;
            uVar24 = 0;
            do {
              if (-1 < iVar6) {
                lVar13 = (long)(iVar28 * local_e8.w * (int)uVar24) * 4 + (long)local_90 * local_108;
                uVar12 = 0;
                do {
                  lVar14 = uVar12 * (long)iVar19;
                  fVar33 = *(float *)((long)local_e8.data + lVar14 * 4 + lVar13);
                  if (0 < iVar15) {
                    uVar32 = 0;
                    do {
                      fVar1 = *(float *)((long)local_e8.data +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar32] * 4 +
                                        lVar14 * 4 + lVar13);
                      if (fVar33 <= fVar1) {
                        fVar33 = fVar1;
                      }
                      uVar32 = uVar32 + 1;
                    } while ((uVar22 & 0xffffffff) != uVar32);
                  }
                  pfVar17[uVar12] = fVar33;
                  uVar12 = uVar12 + 1;
                } while (uVar12 != _w);
              }
              pfVar17 = pfVar17 + (int)_w;
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar29);
          }
          local_108 = local_108 + 1;
        } while (local_108 != uVar31);
      }
    }
    else if ((this->pooling_type == 1) && (0 < (int)uVar11)) {
      local_74 = -iVar21;
      lVar13 = (long)iVar6;
      local_58 = local_e8.cstep * local_e8.elemsize;
      local_b0 = top_blob->cstep * top_blob->elemsize;
      local_78 = local_f0->pad_bottom;
      iVar10 = local_f0->pad_right;
      local_60 = local_e8.data;
      local_84 = local_e8.w;
      local_68 = (float *)top_blob->data;
      uVar24 = (ulong)_w;
      local_7c = local_f0->pad_top;
      local_80 = local_f0->pad_left;
      local_50 = lVar13 * 4 + 4;
      local_100 = 0;
      pfVar17 = local_68 + top_blob->w * (int)local_a8;
      pfVar7 = local_68 + lVar13;
      pfVar8 = local_68;
      pfVar30 = local_68;
      do {
        local_a0 = pfVar8;
        local_98 = pfVar7;
        local_90 = pfVar17;
        if (-1 < (int)local_a8) {
          pfVar17 = (float *)(local_b0 * local_100 + (long)local_68);
          iVar20 = local_f0->stride_h;
          iVar23 = local_f0->stride_w;
          uVar12 = 0;
          do {
            if (-1 < iVar6) {
              uVar32 = 0;
              do {
                if (iVar15 < 1) {
                  fVar33 = 0.0;
                }
                else {
                  fVar33 = 0.0;
                  uVar27 = 0;
                  do {
                    fVar33 = fVar33 + *(float *)((long)local_e8.data +
                                                (long)_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar27] * 4 +
                                                uVar32 * (long)iVar23 * 4 +
                                                (long)(iVar20 * local_e8.w * (int)uVar12) * 4 +
                                                local_58 * local_100);
                    uVar27 = uVar27 + 1;
                  } while ((uVar22 & 0xffffffff) != uVar27);
                }
                pfVar17[uVar32] = fVar33 * (1.0 / (float)iVar15);
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar24);
            }
            pfVar17 = pfVar17 + (int)_w;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar29);
        }
        if ((local_7c != 0) && (-1 < iVar6)) {
          uVar12 = 0;
          do {
            pfVar30[uVar12] = pfVar30[uVar12] * (float)iVar19 * (1.0 / (float)(iVar19 - local_7c));
            uVar12 = uVar12 + 1;
          } while (uVar24 != uVar12);
        }
        if ((local_78 != local_74) && (-1 < iVar6)) {
          uVar12 = 0;
          do {
            local_90[uVar12] =
                 local_90[uVar12] * (float)iVar19 * (1.0 / (float)(iVar19 - (iVar21 + local_78)));
            uVar12 = uVar12 + 1;
          } while (uVar24 != uVar12);
        }
        if (local_80 == 0) {
LAB_0011371a:
          pfVar17 = local_98;
          uVar11 = uVar29;
          if (iVar10 != -iVar18 && -1 < (int)local_a8) {
            do {
              *pfVar17 = *pfVar17 * (float)iVar28 * (1.0 / (float)(iVar28 - (iVar10 + iVar18)));
              uVar11 = uVar11 - 1;
              pfVar17 = pfVar17 + lVar13 + 1;
            } while (uVar11 != 0);
          }
        }
        else {
          pfVar17 = local_a0;
          uVar11 = uVar29;
          if (-1 < (int)local_a8) {
            do {
              *pfVar17 = *pfVar17 * (float)iVar28 * (1.0 / (float)(iVar28 - local_80));
              uVar11 = uVar11 - 1;
              pfVar17 = pfVar17 + lVar13 + 1;
            } while (uVar11 != 0);
            goto LAB_0011371a;
          }
        }
        local_100 = local_100 + 1;
        pfVar30 = (float *)((long)pfVar30 + local_b0);
        pfVar17 = (float *)((long)local_90 + local_b0);
        pfVar7 = (float *)((long)local_98 + local_b0);
        pfVar8 = (float *)((long)local_a0 + local_b0);
      } while (local_100 != uVar31);
    }
    local_70 = uVar31;
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar19 = 0;
  }
LAB_00113a52:
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + -1;
    UNLOCK();
    if (*local_e8.refcount == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(*(void **)((long)local_e8.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_e8.allocator + 8))();
      }
    }
  }
  return iVar19;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            // fix pad
            if (pad_top != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_top);

                outptr = top_blob.channel(q).row(0);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_bottom + htailpad != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                outptr = top_blob.channel(q).row(outh - 1);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_left != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_left);

                outptr = top_blob.channel(q);
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
            if (pad_right + wtailpad != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                outptr = top_blob.channel(q);
                outptr += outw - 1;
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
        }
    }

    return 0;
}